

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmULT.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int FailCount;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleTest((int *)&argv_local,argv);
  g_argc = (int)argv_local;
  g_argv = argv;
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    int FailCount = 0;

    testing::InitGoogleTest(&argc, argv);

    g_argc = argc;
    g_argv = argv;

    FailCount += RUN_ALL_TESTS();

    return FailCount;
}